

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O0

void __thiscall
KokkosTools::ChromeTracing::State::begin_frame(State *this,char *name,StackKind kind)

{
  allocator<char> local_41;
  undefined1 local_40 [8];
  string name_str;
  StackKind kind_local;
  char *name_local;
  State *this_local;
  
  name_str.field_2._12_4_ = kind;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,name,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::
  vector<KokkosTools::ChromeTracing::StackNode,std::allocator<KokkosTools::ChromeTracing::StackNode>>
  ::
  emplace_back<std::__cxx11::string,KokkosTools::ChromeTracing::StackKind&,int&,KokkosTools::ChromeTracing::Now&>
            ((vector<KokkosTools::ChromeTracing::StackNode,std::allocator<KokkosTools::ChromeTracing::StackNode>>
              *)&this->current_stack,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (StackKind *)(name_str.field_2._M_local_buf + 0xc),&this->my_mpi_rank,
             &this->my_base_time);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void begin_frame(const char *name, StackKind kind) {
    std::string name_str(name);
    current_stack.emplace_back(std::move(name_str), kind, my_mpi_rank,
                               my_base_time);
  }